

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O2

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::ZeroObjColSingletonPS::execute
          (ZeroObjColSingletonPS *this,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *x,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *y,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *s,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *r,
          DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
          *cStatus,DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                   *rStatus,bool isOptimal)

{
  pointer pnVar1;
  bool bVar2;
  type_conflict5 tVar3;
  double *pdVar4;
  SPxException *this_00;
  SPxInternalCodeException *pSVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  cpp_dec_float<200U,_int,_void> *pcVar9;
  cpp_dec_float<200u,int,void> *this_01;
  pointer pnVar10;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar11;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar12;
  cpp_dec_float<200U,_int,_void> *pcVar13;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar14;
  soplex *psVar15;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar16;
  byte bVar17;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_7;
  double local_e40;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  aij;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  scale1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  scale2;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  z2;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  z1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a30;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_9b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_930;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_8b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_830;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_7b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_730;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_6b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_630;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_5b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_530;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_430;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3b0;
  undefined1 local_330 [128];
  soplex local_2b0 [112];
  int local_240;
  undefined1 local_23c;
  undefined8 local_238;
  undefined1 local_230 [128];
  soplex local_1b0 [112];
  int local_140;
  undefined1 local_13c;
  undefined8 local_138;
  cpp_dec_float<200U,_int,_void> local_130;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b0;
  
  bVar17 = 0;
  iVar8 = this->m_j;
  if (iVar8 != this->m_old_j) {
    pnVar1 = (x->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              (&pnVar1[this->m_old_j].m_backend,&pnVar1[iVar8].m_backend);
    pnVar1 = (r->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              (&pnVar1[this->m_old_j].m_backend,&pnVar1[this->m_j].m_backend);
    iVar8 = this->m_j;
    cStatus->data[this->m_old_j] = cStatus->data[iVar8];
  }
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::operator[](&aij,&(this->m_row).
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ,iVar8);
  iVar8 = this->m_i;
  pnVar1 = (s->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar10 = pnVar1 + iVar8;
  pnVar14 = &local_b0;
  for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
    (pnVar14->m_backend).data._M_elems[0] = (pnVar10->m_backend).data._M_elems[0];
    pnVar10 = (pointer)((long)pnVar10 + ((ulong)bVar17 * -2 + 1) * 4);
    pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar14 + ((ulong)bVar17 * -2 + 1) * 4);
  }
  local_b0.m_backend.exp = pnVar1[iVar8].m_backend.exp;
  local_b0.m_backend.neg = pnVar1[iVar8].m_backend.neg;
  local_b0.m_backend.fpclass = pnVar1[iVar8].m_backend.fpclass;
  local_b0.m_backend.prec_elem = pnVar1[iVar8].m_backend.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (&local_130,1e-06,(type *)0x0);
  bVar2 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_b0,
                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_130);
  this_01 = (cpp_dec_float<200u,int,void> *)
            ((s->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start + this->m_i);
  if (bVar2) {
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=(this_01,0.0);
  }
  else {
    pdVar4 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (&scale1.m_backend,*pdVar4,(type *)0x0);
    tVar3 = boost::multiprecision::operator>=
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)this_01,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&scale1.m_backend);
    if (tVar3) {
      this_00 = (SPxException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&scale1,"Simplifier: infinite activities - aborting unsimplification",
                 (allocator *)&scale2);
      SPxException::SPxException(this_00,(string *)&scale1);
      __cxa_throw(this_00,&SPxException::typeinfo,SPxException::~SPxException);
    }
  }
  lVar6 = 0x1c;
  pnVar14 = &this->m_lhs;
  psVar15 = local_1b0;
  for (lVar7 = lVar6; lVar7 != 0; lVar7 = lVar7 + -1) {
    *(uint *)psVar15 = (pnVar14->m_backend).data._M_elems[0];
    pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar14 + (ulong)bVar17 * -8 + 4);
    psVar15 = psVar15 + (ulong)bVar17 * -8 + 4;
  }
  local_140 = (this->m_lhs).m_backend.exp;
  local_13c = (this->m_lhs).m_backend.neg;
  local_138._0_4_ = (this->m_lhs).m_backend.fpclass;
  local_138._4_4_ = (this->m_lhs).m_backend.prec_elem;
  iVar8 = this->m_i;
  pnVar1 = (s->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar10 = pnVar1 + iVar8;
  pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *)local_230;
  for (lVar7 = lVar6; lVar7 != 0; lVar7 = lVar7 + -1) {
    (pnVar14->m_backend).data._M_elems[0] = (pnVar10->m_backend).data._M_elems[0];
    pnVar10 = (pointer)((long)pnVar10 + ((ulong)bVar17 * -2 + 1) * 4);
    pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar14 + ((ulong)bVar17 * -2 + 1) * 4);
  }
  local_230._112_4_ = pnVar1[iVar8].m_backend.exp;
  local_230[0x74] = pnVar1[iVar8].m_backend.neg;
  local_230._120_8_ = *(undefined8 *)&pnVar1[iVar8].m_backend.fpclass;
  maxAbs<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
            (&scale1,local_1b0,
             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)local_230,
             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)local_230._120_8_);
  pnVar14 = &this->m_rhs;
  psVar15 = local_2b0;
  for (lVar7 = lVar6; lVar7 != 0; lVar7 = lVar7 + -1) {
    *(uint *)psVar15 = (pnVar14->m_backend).data._M_elems[0];
    pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar14 + (ulong)bVar17 * -8 + 4);
    psVar15 = psVar15 + (ulong)bVar17 * -8 + 4;
  }
  local_240 = (this->m_rhs).m_backend.exp;
  local_23c = (this->m_rhs).m_backend.neg;
  local_238._0_4_ = (this->m_rhs).m_backend.fpclass;
  local_238._4_4_ = (this->m_rhs).m_backend.prec_elem;
  iVar8 = this->m_i;
  pnVar1 = (s->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar10 = pnVar1 + iVar8;
  pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *)local_330;
  for (; lVar6 != 0; lVar6 = lVar6 + -1) {
    (pnVar14->m_backend).data._M_elems[0] = (pnVar10->m_backend).data._M_elems[0];
    pnVar10 = (pointer)((long)pnVar10 + ((ulong)bVar17 * -2 + 1) * 4);
    pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar14 + ((ulong)bVar17 * -2 + 1) * 4);
  }
  local_330._112_4_ = pnVar1[iVar8].m_backend.exp;
  local_330[0x74] = pnVar1[iVar8].m_backend.neg;
  local_330._120_8_ = *(undefined8 *)&pnVar1[iVar8].m_backend.fpclass;
  maxAbs<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
            (&scale2,local_2b0,
             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)local_330,
             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)local_330._120_8_);
  z1.m_backend.data._M_elems[0] = 0;
  z1.m_backend.data._M_elems[1] = 0x3ff00000;
  tVar3 = boost::multiprecision::operator<(&scale1,(double *)&z1);
  if (tVar3) {
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&scale1,1.0);
  }
  z1.m_backend.data._M_elems[0] = 0;
  z1.m_backend.data._M_elems[1] = 0x3ff00000;
  tVar3 = boost::multiprecision::operator<(&scale2,(double *)&z1);
  if (tVar3) {
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&scale2,1.0);
  }
  z2.m_backend.fpclass = cpp_dec_float_finite;
  z2.m_backend.prec_elem = 0x1c;
  z2.m_backend.data._M_elems[0] = 0;
  z2.m_backend.data._M_elems[1] = 0;
  z2.m_backend.data._M_elems[2] = 0;
  z2.m_backend.data._M_elems[3] = 0;
  z2.m_backend.data._M_elems[4] = 0;
  z2.m_backend.data._M_elems[5] = 0;
  z2.m_backend.data._M_elems[6] = 0;
  z2.m_backend.data._M_elems[7] = 0;
  z2.m_backend.data._M_elems[8] = 0;
  z2.m_backend.data._M_elems[9] = 0;
  z2.m_backend.data._M_elems[10] = 0;
  z2.m_backend.data._M_elems[0xb] = 0;
  z2.m_backend.data._M_elems[0xc] = 0;
  z2.m_backend.data._M_elems[0xd] = 0;
  z2.m_backend.data._M_elems[0xe] = 0;
  z2.m_backend.data._M_elems[0xf] = 0;
  z2.m_backend.data._M_elems[0x10] = 0;
  z2.m_backend.data._M_elems[0x11] = 0;
  z2.m_backend.data._M_elems[0x12] = 0;
  z2.m_backend.data._M_elems[0x13] = 0;
  z2.m_backend.data._M_elems[0x14] = 0;
  z2.m_backend.data._M_elems[0x15] = 0;
  z2.m_backend.data._M_elems[0x16] = 0;
  z2.m_backend.data._M_elems[0x17] = 0;
  z2.m_backend.data._M_elems[0x18] = 0;
  z2.m_backend.data._M_elems[0x19] = 0;
  z2.m_backend.data._M_elems._104_5_ = 0;
  z2.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  z2.m_backend.exp = 0;
  z2.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (&z2.m_backend,&(this->m_lhs).m_backend,&scale1.m_backend);
  result_1.m_backend.fpclass = cpp_dec_float_finite;
  result_1.m_backend.prec_elem = 0x1c;
  result_1.m_backend.data._M_elems[0] = 0;
  result_1.m_backend.data._M_elems[1] = 0;
  result_1.m_backend.data._M_elems[2] = 0;
  result_1.m_backend.data._M_elems[3] = 0;
  result_1.m_backend.data._M_elems[4] = 0;
  result_1.m_backend.data._M_elems[5] = 0;
  result_1.m_backend.data._M_elems[6] = 0;
  result_1.m_backend.data._M_elems[7] = 0;
  result_1.m_backend.data._M_elems[8] = 0;
  result_1.m_backend.data._M_elems[9] = 0;
  result_1.m_backend.data._M_elems[10] = 0;
  result_1.m_backend.data._M_elems[0xb] = 0;
  result_1.m_backend.data._M_elems[0xc] = 0;
  result_1.m_backend.data._M_elems[0xd] = 0;
  result_1.m_backend.data._M_elems[0xe] = 0;
  result_1.m_backend.data._M_elems[0xf] = 0;
  result_1.m_backend.data._M_elems[0x10] = 0;
  result_1.m_backend.data._M_elems[0x11] = 0;
  result_1.m_backend.data._M_elems[0x12] = 0;
  result_1.m_backend.data._M_elems[0x13] = 0;
  result_1.m_backend.data._M_elems[0x14] = 0;
  result_1.m_backend.data._M_elems[0x15] = 0;
  result_1.m_backend.data._M_elems[0x16] = 0;
  result_1.m_backend.data._M_elems[0x17] = 0;
  result_1.m_backend.data._M_elems[0x18] = 0;
  result_1.m_backend.data._M_elems[0x19] = 0;
  result_1.m_backend.data._M_elems._104_5_ = 0;
  result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  result_1.m_backend.exp = 0;
  result_1.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (&result_1.m_backend,
             &(s->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[this->m_i].m_backend,&scale1.m_backend);
  z1.m_backend.fpclass = cpp_dec_float_finite;
  z1.m_backend.prec_elem = 0x1c;
  z1.m_backend.data._M_elems[0] = 0;
  z1.m_backend.data._M_elems[1] = 0;
  z1.m_backend.data._M_elems[2] = 0;
  z1.m_backend.data._M_elems[3] = 0;
  z1.m_backend.data._M_elems[4] = 0;
  z1.m_backend.data._M_elems[5] = 0;
  z1.m_backend.data._M_elems[6] = 0;
  z1.m_backend.data._M_elems[7] = 0;
  z1.m_backend.data._M_elems[8] = 0;
  z1.m_backend.data._M_elems[9] = 0;
  z1.m_backend.data._M_elems[10] = 0;
  z1.m_backend.data._M_elems[0xb] = 0;
  z1.m_backend.data._M_elems[0xc] = 0;
  z1.m_backend.data._M_elems[0xd] = 0;
  z1.m_backend.data._M_elems[0xe] = 0;
  z1.m_backend.data._M_elems[0xf] = 0;
  z1.m_backend.data._M_elems[0x10] = 0;
  z1.m_backend.data._M_elems[0x11] = 0;
  z1.m_backend.data._M_elems[0x12] = 0;
  z1.m_backend.data._M_elems[0x13] = 0;
  z1.m_backend.data._M_elems[0x14] = 0;
  z1.m_backend.data._M_elems[0x15] = 0;
  z1.m_backend.data._M_elems[0x16] = 0;
  z1.m_backend.data._M_elems[0x17] = 0;
  z1.m_backend.data._M_elems[0x18] = 0;
  z1.m_backend.data._M_elems[0x19] = 0;
  z1.m_backend.data._M_elems._104_5_ = 0;
  z1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  z1.m_backend.exp = 0;
  z1.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (&z1.m_backend,&z2.m_backend,&result_1.m_backend);
  result_1.m_backend.fpclass = cpp_dec_float_finite;
  result_1.m_backend.prec_elem = 0x1c;
  result_1.m_backend.data._M_elems[0] = 0;
  result_1.m_backend.data._M_elems[1] = 0;
  result_1.m_backend.data._M_elems[2] = 0;
  result_1.m_backend.data._M_elems[3] = 0;
  result_1.m_backend.data._M_elems[4] = 0;
  result_1.m_backend.data._M_elems[5] = 0;
  result_1.m_backend.data._M_elems[6] = 0;
  result_1.m_backend.data._M_elems[7] = 0;
  result_1.m_backend.data._M_elems[8] = 0;
  result_1.m_backend.data._M_elems[9] = 0;
  result_1.m_backend.data._M_elems[10] = 0;
  result_1.m_backend.data._M_elems[0xb] = 0;
  result_1.m_backend.data._M_elems[0xc] = 0;
  result_1.m_backend.data._M_elems[0xd] = 0;
  result_1.m_backend.data._M_elems[0xe] = 0;
  result_1.m_backend.data._M_elems[0xf] = 0;
  result_1.m_backend.data._M_elems[0x10] = 0;
  result_1.m_backend.data._M_elems[0x11] = 0;
  result_1.m_backend.data._M_elems[0x12] = 0;
  result_1.m_backend.data._M_elems[0x13] = 0;
  result_1.m_backend.data._M_elems[0x14] = 0;
  result_1.m_backend.data._M_elems[0x15] = 0;
  result_1.m_backend.data._M_elems[0x16] = 0;
  result_1.m_backend.data._M_elems[0x17] = 0;
  result_1.m_backend.data._M_elems[0x18] = 0;
  result_1.m_backend.data._M_elems[0x19] = 0;
  result_1.m_backend.data._M_elems._104_5_ = 0;
  result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  result_1.m_backend.exp = 0;
  result_1.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (&result_1.m_backend,&(this->m_rhs).m_backend,&scale2.m_backend);
  result_4.m_backend.fpclass = cpp_dec_float_finite;
  result_4.m_backend.prec_elem = 0x1c;
  result_4.m_backend.data._M_elems[0] = 0;
  result_4.m_backend.data._M_elems[1] = 0;
  result_4.m_backend.data._M_elems[2] = 0;
  result_4.m_backend.data._M_elems[3] = 0;
  result_4.m_backend.data._M_elems[4] = 0;
  result_4.m_backend.data._M_elems[5] = 0;
  result_4.m_backend.data._M_elems[6] = 0;
  result_4.m_backend.data._M_elems[7] = 0;
  result_4.m_backend.data._M_elems[8] = 0;
  result_4.m_backend.data._M_elems[9] = 0;
  result_4.m_backend.data._M_elems[10] = 0;
  result_4.m_backend.data._M_elems[0xb] = 0;
  result_4.m_backend.data._M_elems[0xc] = 0;
  result_4.m_backend.data._M_elems[0xd] = 0;
  result_4.m_backend.data._M_elems[0xe] = 0;
  result_4.m_backend.data._M_elems[0xf] = 0;
  result_4.m_backend.data._M_elems[0x10] = 0;
  result_4.m_backend.data._M_elems[0x11] = 0;
  result_4.m_backend.data._M_elems[0x12] = 0;
  result_4.m_backend.data._M_elems[0x13] = 0;
  result_4.m_backend.data._M_elems[0x14] = 0;
  result_4.m_backend.data._M_elems[0x15] = 0;
  result_4.m_backend.data._M_elems[0x16] = 0;
  result_4.m_backend.data._M_elems[0x17] = 0;
  result_4.m_backend.data._M_elems[0x18] = 0;
  result_4.m_backend.data._M_elems[0x19] = 0;
  result_4.m_backend.data._M_elems._104_5_ = 0;
  result_4.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  result_4.m_backend.exp = 0;
  result_4.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (&result_4.m_backend,
             &(s->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[this->m_i].m_backend,&scale2.m_backend);
  z2.m_backend.fpclass = cpp_dec_float_finite;
  z2.m_backend.prec_elem = 0x1c;
  z2.m_backend.data._M_elems[0] = 0;
  z2.m_backend.data._M_elems[1] = 0;
  z2.m_backend.data._M_elems[2] = 0;
  z2.m_backend.data._M_elems[3] = 0;
  z2.m_backend.data._M_elems[4] = 0;
  z2.m_backend.data._M_elems[5] = 0;
  z2.m_backend.data._M_elems[6] = 0;
  z2.m_backend.data._M_elems[7] = 0;
  z2.m_backend.data._M_elems[8] = 0;
  z2.m_backend.data._M_elems[9] = 0;
  z2.m_backend.data._M_elems[10] = 0;
  z2.m_backend.data._M_elems[0xb] = 0;
  z2.m_backend.data._M_elems[0xc] = 0;
  z2.m_backend.data._M_elems[0xd] = 0;
  z2.m_backend.data._M_elems[0xe] = 0;
  z2.m_backend.data._M_elems[0xf] = 0;
  z2.m_backend.data._M_elems[0x10] = 0;
  z2.m_backend.data._M_elems[0x11] = 0;
  z2.m_backend.data._M_elems[0x12] = 0;
  z2.m_backend.data._M_elems[0x13] = 0;
  z2.m_backend.data._M_elems[0x14] = 0;
  z2.m_backend.data._M_elems[0x15] = 0;
  z2.m_backend.data._M_elems[0x16] = 0;
  z2.m_backend.data._M_elems[0x17] = 0;
  z2.m_backend.data._M_elems[0x18] = 0;
  z2.m_backend.data._M_elems[0x19] = 0;
  z2.m_backend.data._M_elems._104_5_ = 0;
  z2.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  z2.m_backend.exp = 0;
  z2.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (&z2.m_backend,&result_1.m_backend,&result_4.m_backend);
  pcVar13 = &z1.m_backend;
  pnVar14 = &local_3b0;
  for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
    (pnVar14->m_backend).data._M_elems[0] = (pcVar13->data)._M_elems[0];
    pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar17 * -8 + 4);
    pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar14 + ((ulong)bVar17 * -2 + 1) * 4);
  }
  local_3b0.m_backend.exp = z1.m_backend.exp;
  local_3b0.m_backend.neg = z1.m_backend.neg;
  local_3b0.m_backend.fpclass = z1.m_backend.fpclass;
  local_3b0.m_backend.prec_elem = z1.m_backend.prec_elem;
  (*(this->super_PostStep)._vptr_PostStep[7])(&local_430,this);
  bVar2 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_3b0,&local_430);
  if (bVar2) {
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&z1,0.0);
  }
  pnVar14 = &z2;
  pnVar11 = &local_4b0;
  for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
    (pnVar11->m_backend).data._M_elems[0] = (pnVar14->m_backend).data._M_elems[0];
    pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar14 + ((ulong)bVar17 * -2 + 1) * 4);
    pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar11 + ((ulong)bVar17 * -2 + 1) * 4);
  }
  local_4b0.m_backend.exp = z2.m_backend.exp;
  local_4b0.m_backend.neg = z2.m_backend.neg;
  local_4b0.m_backend.fpclass = z2.m_backend.fpclass;
  local_4b0.m_backend.prec_elem = z2.m_backend.prec_elem;
  (*(this->super_PostStep)._vptr_PostStep[7])(&local_530,this);
  bVar2 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_4b0,&local_530);
  if (bVar2) {
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&z2,0.0);
  }
  result_7.m_backend.data._M_elems._0_8_ = (ulong)result_7.m_backend.data._M_elems[1] << 0x20;
  tVar3 = boost::multiprecision::operator>(&aij,(int *)&result_7);
  if (tVar3) {
    pcVar13 = &z1.m_backend;
    pcVar9 = &scale1.m_backend;
  }
  else {
    pcVar13 = &z2.m_backend;
    pcVar9 = &scale2.m_backend;
  }
  result_4.m_backend.fpclass = cpp_dec_float_finite;
  result_4.m_backend.prec_elem = 0x1c;
  result_4.m_backend.neg = false;
  result_4.m_backend.exp = 0;
  result_4.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  result_4.m_backend.data._M_elems._104_5_ = 0;
  result_4.m_backend.data._M_elems[0x18] = 0;
  result_4.m_backend.data._M_elems[0x19] = 0;
  result_4.m_backend.data._M_elems[0x16] = 0;
  result_4.m_backend.data._M_elems[0x17] = 0;
  result_4.m_backend.data._M_elems[0x14] = 0;
  result_4.m_backend.data._M_elems[0x15] = 0;
  result_4.m_backend.data._M_elems[0x12] = 0;
  result_4.m_backend.data._M_elems[0x13] = 0;
  result_4.m_backend.data._M_elems[0x10] = 0;
  result_4.m_backend.data._M_elems[0x11] = 0;
  result_4.m_backend.data._M_elems[0xe] = 0;
  result_4.m_backend.data._M_elems[0xf] = 0;
  result_4.m_backend.data._M_elems[0xc] = 0;
  result_4.m_backend.data._M_elems[0xd] = 0;
  result_4.m_backend.data._M_elems[10] = 0;
  result_4.m_backend.data._M_elems[0xb] = 0;
  result_4.m_backend.data._M_elems[8] = 0;
  result_4.m_backend.data._M_elems[9] = 0;
  result_4.m_backend.data._M_elems[6] = 0;
  result_4.m_backend.data._M_elems[7] = 0;
  result_4.m_backend.data._M_elems[4] = 0;
  result_4.m_backend.data._M_elems[5] = 0;
  result_4.m_backend.data._M_elems[2] = 0;
  result_4.m_backend.data._M_elems[3] = 0;
  result_4.m_backend.data._M_elems[0] = 0;
  result_4.m_backend.data._M_elems[1] = 0;
  boost::multiprecision::default_ops::
  eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (&result_4.m_backend,pcVar13,pcVar9);
  result_1.m_backend.fpclass = cpp_dec_float_finite;
  result_1.m_backend.prec_elem = 0x1c;
  result_1.m_backend.data._M_elems[0] = 0;
  result_1.m_backend.data._M_elems[1] = 0;
  result_1.m_backend.data._M_elems[2] = 0;
  result_1.m_backend.data._M_elems[3] = 0;
  result_1.m_backend.data._M_elems[4] = 0;
  result_1.m_backend.data._M_elems[5] = 0;
  result_1.m_backend.data._M_elems[6] = 0;
  result_1.m_backend.data._M_elems[7] = 0;
  result_1.m_backend.data._M_elems[8] = 0;
  result_1.m_backend.data._M_elems[9] = 0;
  result_1.m_backend.data._M_elems[10] = 0;
  result_1.m_backend.data._M_elems[0xb] = 0;
  result_1.m_backend.data._M_elems[0xc] = 0;
  result_1.m_backend.data._M_elems[0xd] = 0;
  result_1.m_backend.data._M_elems[0xe] = 0;
  result_1.m_backend.data._M_elems[0xf] = 0;
  result_1.m_backend.data._M_elems[0x10] = 0;
  result_1.m_backend.data._M_elems[0x11] = 0;
  result_1.m_backend.data._M_elems[0x12] = 0;
  result_1.m_backend.data._M_elems[0x13] = 0;
  result_1.m_backend.data._M_elems[0x14] = 0;
  result_1.m_backend.data._M_elems[0x15] = 0;
  result_1.m_backend.data._M_elems[0x16] = 0;
  result_1.m_backend.data._M_elems[0x17] = 0;
  result_1.m_backend.data._M_elems[0x18] = 0;
  result_1.m_backend.data._M_elems[0x19] = 0;
  result_1.m_backend.data._M_elems._104_5_ = 0;
  result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  result_1.m_backend.exp = 0;
  result_1.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (&result_1.m_backend,&result_4.m_backend,&aij.m_backend);
  result_9.m_backend.data._M_elems._0_8_ = (ulong)result_9.m_backend.data._M_elems[1] << 0x20;
  tVar3 = boost::multiprecision::operator>
                    ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&aij.m_backend,(int *)&result_9);
  if (tVar3) {
    pcVar13 = &z2.m_backend;
    pcVar9 = &scale2.m_backend;
  }
  else {
    pcVar13 = &z1.m_backend;
    pcVar9 = &scale1.m_backend;
  }
  result_7.m_backend.fpclass = cpp_dec_float_finite;
  result_7.m_backend.prec_elem = 0x1c;
  result_7.m_backend.neg = false;
  result_7.m_backend.exp = 0;
  result_7.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  result_7.m_backend.data._M_elems._104_5_ = 0;
  result_7.m_backend.data._M_elems[0x18] = 0;
  result_7.m_backend.data._M_elems[0x19] = 0;
  result_7.m_backend.data._M_elems[0x16] = 0;
  result_7.m_backend.data._M_elems[0x17] = 0;
  result_7.m_backend.data._M_elems[0x14] = 0;
  result_7.m_backend.data._M_elems[0x15] = 0;
  result_7.m_backend.data._M_elems[0x12] = 0;
  result_7.m_backend.data._M_elems[0x13] = 0;
  result_7.m_backend.data._M_elems[0x10] = 0;
  result_7.m_backend.data._M_elems[0x11] = 0;
  result_7.m_backend.data._M_elems[0xe] = 0;
  result_7.m_backend.data._M_elems[0xf] = 0;
  result_7.m_backend.data._M_elems[0xc] = 0;
  result_7.m_backend.data._M_elems[0xd] = 0;
  result_7.m_backend.data._M_elems[10] = 0;
  result_7.m_backend.data._M_elems[0xb] = 0;
  result_7.m_backend.data._M_elems[8] = 0;
  result_7.m_backend.data._M_elems[9] = 0;
  result_7.m_backend.data._M_elems[6] = 0;
  result_7.m_backend.data._M_elems[7] = 0;
  result_7.m_backend.data._M_elems[4] = 0;
  result_7.m_backend.data._M_elems[5] = 0;
  result_7.m_backend.data._M_elems[2] = 0;
  result_7.m_backend.data._M_elems[3] = 0;
  result_7.m_backend.data._M_elems[0] = 0;
  result_7.m_backend.data._M_elems[1] = 0;
  boost::multiprecision::default_ops::
  eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (&result_7.m_backend,pcVar13,pcVar9);
  result_4.m_backend.fpclass = cpp_dec_float_finite;
  result_4.m_backend.prec_elem = 0x1c;
  result_4.m_backend.data._M_elems[0] = 0;
  result_4.m_backend.data._M_elems[1] = 0;
  result_4.m_backend.data._M_elems[2] = 0;
  result_4.m_backend.data._M_elems[3] = 0;
  result_4.m_backend.data._M_elems[4] = 0;
  result_4.m_backend.data._M_elems[5] = 0;
  result_4.m_backend.data._M_elems[6] = 0;
  result_4.m_backend.data._M_elems[7] = 0;
  result_4.m_backend.data._M_elems[8] = 0;
  result_4.m_backend.data._M_elems[9] = 0;
  result_4.m_backend.data._M_elems[10] = 0;
  result_4.m_backend.data._M_elems[0xb] = 0;
  result_4.m_backend.data._M_elems[0xc] = 0;
  result_4.m_backend.data._M_elems[0xd] = 0;
  result_4.m_backend.data._M_elems[0xe] = 0;
  result_4.m_backend.data._M_elems[0xf] = 0;
  result_4.m_backend.data._M_elems[0x10] = 0;
  result_4.m_backend.data._M_elems[0x11] = 0;
  result_4.m_backend.data._M_elems[0x12] = 0;
  result_4.m_backend.data._M_elems[0x13] = 0;
  result_4.m_backend.data._M_elems[0x14] = 0;
  result_4.m_backend.data._M_elems[0x15] = 0;
  result_4.m_backend.data._M_elems[0x16] = 0;
  result_4.m_backend.data._M_elems[0x17] = 0;
  result_4.m_backend.data._M_elems[0x18] = 0;
  result_4.m_backend.data._M_elems[0x19] = 0;
  result_4.m_backend.data._M_elems._104_5_ = 0;
  result_4.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  result_4.m_backend.exp = 0;
  result_4.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (&result_4.m_backend,&result_7.m_backend,&aij.m_backend);
  pnVar14 = &result_1;
  pnVar11 = &local_5b0;
  for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
    (pnVar11->m_backend).data._M_elems[0] = (pnVar14->m_backend).data._M_elems[0];
    pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar14 + ((ulong)bVar17 * -2 + 1) * 4);
    pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar11 + ((ulong)bVar17 * -2 + 1) * 4);
  }
  local_5b0.m_backend.exp = result_1.m_backend.exp;
  local_5b0.m_backend.neg = result_1.m_backend.neg;
  local_5b0.m_backend.fpclass = result_1.m_backend.fpclass;
  local_5b0.m_backend.prec_elem = result_1.m_backend.prec_elem;
  (*(this->super_PostStep)._vptr_PostStep[6])(&local_630,this);
  bVar2 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_5b0,&local_630);
  if (bVar2) {
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&result_1,0.0);
  }
  pnVar14 = &result_4;
  pnVar11 = &local_6b0;
  for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
    (pnVar11->m_backend).data._M_elems[0] = (pnVar14->m_backend).data._M_elems[0];
    pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar14 + ((ulong)bVar17 * -2 + 1) * 4);
    pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar11 + ((ulong)bVar17 * -2 + 1) * 4);
  }
  local_6b0.m_backend.exp = result_4.m_backend.exp;
  local_6b0.m_backend.neg = result_4.m_backend.neg;
  local_6b0.m_backend.fpclass = result_4.m_backend.fpclass;
  local_6b0.m_backend.prec_elem = result_4.m_backend.prec_elem;
  (*(this->super_PostStep)._vptr_PostStep[6])(&local_730,this);
  bVar2 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_6b0,&local_730);
  if (bVar2) {
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&result_4,0.0);
  }
  switch(rStatus->data[this->m_i]) {
  case ON_UPPER:
    pdVar4 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (&result_7.m_backend,-*pdVar4,(type *)0x0);
    tVar3 = boost::multiprecision::operator<=
                      (&this->m_lower,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&result_7.m_backend);
    if (tVar3) {
      pdVar4 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                (&result_9.m_backend,*pdVar4,(type *)0x0);
      tVar3 = boost::multiprecision::operator>=
                        (&this->m_upper,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&result_9.m_backend);
      if (tVar3) {
LAB_00421681:
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)
                   ((x->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + this->m_j),0.0);
        cStatus->data[this->m_j] = ZERO;
        goto LAB_00421b6f;
      }
    }
    bVar2 = boost::multiprecision::operator==(&this->m_lower,&this->m_upper);
    if (!bVar2) {
      result_7.m_backend.data._M_elems._0_8_ =
           result_7.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
      tVar3 = boost::multiprecision::operator>(&aij,(int *)&result_7);
      if (!tVar3) {
        result_7.m_backend.data._M_elems._0_8_ =
             result_7.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
        tVar3 = boost::multiprecision::operator<(&aij,(int *)&result_7);
        if (!tVar3) {
          pSVar5 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
          std::__cxx11::string::string
                    ((string *)&result_7,"XMAISM02 This should never happen.",(allocator *)&result_9
                    );
          SPxInternalCodeException::SPxInternalCodeException(pSVar5,(string *)&result_7);
          __cxa_throw(pSVar5,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
        }
LAB_00421b4a:
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                  (&(x->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[this->m_j].m_backend,
                   &(this->m_upper).m_backend);
        cStatus->data[this->m_j] = ON_UPPER;
        goto LAB_00421b6f;
      }
LAB_00421a54:
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                (&(x->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[this->m_j].m_backend,
                 &(this->m_lower).m_backend);
      cStatus->data[this->m_j] = ON_LOWER;
      goto LAB_00421b6f;
    }
    break;
  case ON_LOWER:
    pdVar4 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (&result_7.m_backend,-*pdVar4,(type *)0x0);
    tVar3 = boost::multiprecision::operator<=
                      (&this->m_lower,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&result_7.m_backend);
    if (tVar3) {
      pdVar4 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                (&result_9.m_backend,*pdVar4,(type *)0x0);
      tVar3 = boost::multiprecision::operator>=
                        (&this->m_upper,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&result_9.m_backend);
      if (tVar3) goto LAB_00421681;
    }
    bVar2 = boost::multiprecision::operator==(&this->m_lower,&this->m_upper);
    if (!bVar2) {
      result_7.m_backend.data._M_elems._0_8_ =
           result_7.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
      tVar3 = boost::multiprecision::operator>(&aij,(int *)&result_7);
      if (tVar3) goto LAB_00421b4a;
      result_7.m_backend.data._M_elems._0_8_ =
           result_7.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
      tVar3 = boost::multiprecision::operator<(&aij,(int *)&result_7);
      if (!tVar3) {
        pSVar5 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string
                  ((string *)&result_7,"XMAISM01 This should never happen.",(allocator *)&result_9);
        SPxInternalCodeException::SPxInternalCodeException(pSVar5,(string *)&result_7);
        __cxa_throw(pSVar5,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
      }
      goto LAB_00421a54;
    }
    break;
  case FIXED:
    pdVar4 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (&result_7.m_backend,-*pdVar4,(type *)0x0);
    tVar3 = boost::multiprecision::operator<=
                      (&this->m_lower,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&result_7.m_backend);
    if (tVar3) {
      pdVar4 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                (&result_9.m_backend,*pdVar4,(type *)0x0);
      tVar3 = boost::multiprecision::operator>=
                        (&this->m_upper,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&result_9.m_backend);
      if (tVar3) goto LAB_00421681;
    }
    result_9.m_backend.fpclass = cpp_dec_float_finite;
    result_9.m_backend.prec_elem = 0x1c;
    result_9.m_backend.data._M_elems[0] = 0;
    result_9.m_backend.data._M_elems[1] = 0;
    result_9.m_backend.data._M_elems[2] = 0;
    result_9.m_backend.data._M_elems[3] = 0;
    result_9.m_backend.data._M_elems[4] = 0;
    result_9.m_backend.data._M_elems[5] = 0;
    result_9.m_backend.data._M_elems[6] = 0;
    result_9.m_backend.data._M_elems[7] = 0;
    result_9.m_backend.data._M_elems[8] = 0;
    result_9.m_backend.data._M_elems[9] = 0;
    result_9.m_backend.data._M_elems[10] = 0;
    result_9.m_backend.data._M_elems[0xb] = 0;
    result_9.m_backend.data._M_elems[0xc] = 0;
    result_9.m_backend.data._M_elems[0xd] = 0;
    result_9.m_backend.data._M_elems[0xe] = 0;
    result_9.m_backend.data._M_elems[0xf] = 0;
    result_9.m_backend.data._M_elems[0x10] = 0;
    result_9.m_backend.data._M_elems[0x11] = 0;
    result_9.m_backend.data._M_elems[0x12] = 0;
    result_9.m_backend.data._M_elems[0x13] = 0;
    result_9.m_backend.data._M_elems[0x14] = 0;
    result_9.m_backend.data._M_elems[0x15] = 0;
    result_9.m_backend.data._M_elems[0x16] = 0;
    result_9.m_backend.data._M_elems[0x17] = 0;
    result_9.m_backend.data._M_elems[0x18] = 0;
    result_9.m_backend.data._M_elems[0x19] = 0;
    result_9.m_backend.data._M_elems._104_5_ = 0;
    result_9.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    result_9.m_backend.exp = 0;
    result_9.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_add_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&result_9.m_backend,&(this->m_lower).m_backend,&(this->m_upper).m_backend);
    local_e40 = 2.0;
    result_7.m_backend.fpclass = cpp_dec_float_finite;
    result_7.m_backend.prec_elem = 0x1c;
    result_7.m_backend.data._M_elems[0] = 0;
    result_7.m_backend.data._M_elems[1] = 0;
    result_7.m_backend.data._M_elems[2] = 0;
    result_7.m_backend.data._M_elems[3] = 0;
    result_7.m_backend.data._M_elems[4] = 0;
    result_7.m_backend.data._M_elems[5] = 0;
    result_7.m_backend.data._M_elems[6] = 0;
    result_7.m_backend.data._M_elems[7] = 0;
    result_7.m_backend.data._M_elems[8] = 0;
    result_7.m_backend.data._M_elems[9] = 0;
    result_7.m_backend.data._M_elems[10] = 0;
    result_7.m_backend.data._M_elems[0xb] = 0;
    result_7.m_backend.data._M_elems[0xc] = 0;
    result_7.m_backend.data._M_elems[0xd] = 0;
    result_7.m_backend.data._M_elems[0xe] = 0;
    result_7.m_backend.data._M_elems[0xf] = 0;
    result_7.m_backend.data._M_elems[0x10] = 0;
    result_7.m_backend.data._M_elems[0x11] = 0;
    result_7.m_backend.data._M_elems[0x12] = 0;
    result_7.m_backend.data._M_elems[0x13] = 0;
    result_7.m_backend.data._M_elems[0x14] = 0;
    result_7.m_backend.data._M_elems[0x15] = 0;
    result_7.m_backend.data._M_elems[0x16] = 0;
    result_7.m_backend.data._M_elems[0x17] = 0;
    result_7.m_backend.data._M_elems[0x18] = 0;
    result_7.m_backend.data._M_elems[0x19] = 0;
    result_7.m_backend.data._M_elems._104_5_ = 0;
    result_7.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    result_7.m_backend.exp = 0;
    result_7.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double>
              (&result_7.m_backend,&result_9.m_backend,&local_e40);
    iVar8 = this->m_j;
    pnVar1 = (x->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pcVar13 = &result_7.m_backend;
    pnVar10 = pnVar1 + iVar8;
    for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
      (pnVar10->m_backend).data._M_elems[0] = (pcVar13->data)._M_elems[0];
      pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar17 * -8 + 4);
      pnVar10 = (pointer)((long)pnVar10 + ((ulong)bVar17 * -2 + 1) * 4);
    }
    pnVar1[iVar8].m_backend.exp = result_7.m_backend.exp;
    pnVar1[iVar8].m_backend.neg = result_7.m_backend.neg;
    pnVar1[iVar8].m_backend.fpclass = result_7.m_backend.fpclass;
    pnVar1[iVar8].m_backend.prec_elem = result_7.m_backend.prec_elem;
    goto LAB_0042196c;
  default:
    pSVar5 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string
              ((string *)&result_7,"XMAISM04 This should never happen.",(allocator *)&result_9);
    SPxInternalCodeException::SPxInternalCodeException(pSVar5,(string *)&result_7);
    __cxa_throw(pSVar5,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
  case BASIC:
    pnVar14 = &this->m_lower;
    lVar6 = 0x1c;
    pnVar11 = pnVar14;
    pnVar12 = &local_7b0;
    for (lVar7 = lVar6; lVar7 != 0; lVar7 = lVar7 + -1) {
      (pnVar12->m_backend).data._M_elems[0] = (pnVar11->m_backend).data._M_elems[0];
      pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar11 + (ulong)bVar17 * -8 + 4);
      pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar12 + ((ulong)bVar17 * -2 + 1) * 4);
    }
    local_7b0.m_backend.exp = (this->m_lower).m_backend.exp;
    local_7b0.m_backend.neg = (this->m_lower).m_backend.neg;
    local_7b0.m_backend.fpclass = (this->m_lower).m_backend.fpclass;
    local_7b0.m_backend.prec_elem = (this->m_lower).m_backend.prec_elem;
    pnVar11 = &result_1;
    pnVar12 = &local_830;
    for (; lVar6 != 0; lVar6 = lVar6 + -1) {
      (pnVar12->m_backend).data._M_elems[0] = (pnVar11->m_backend).data._M_elems[0];
      pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar11 + ((ulong)bVar17 * -2 + 1) * 4);
      pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar12 + ((ulong)bVar17 * -2 + 1) * 4);
    }
    local_830.m_backend.exp = result_1.m_backend.exp;
    local_830.m_backend.neg = result_1.m_backend.neg;
    local_830.m_backend.fpclass = result_1.m_backend.fpclass;
    local_830.m_backend.prec_elem = result_1.m_backend.prec_elem;
    (*(this->super_PostStep)._vptr_PostStep[6])(&local_8b0,this);
    bVar2 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_7b0,&local_830,&local_8b0);
    if (bVar2) {
      pdVar4 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                (&result_7.m_backend,-*pdVar4,(type *)0x0);
      tVar3 = boost::multiprecision::operator>
                        (pnVar14,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)&result_7.m_backend);
      if (tVar3) {
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                  (&(x->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[this->m_j].m_backend,
                   &pnVar14->m_backend);
        bVar2 = boost::multiprecision::operator==(pnVar14,&this->m_upper);
        cStatus->data[this->m_j] = bVar2 + ON_LOWER;
        goto LAB_00421b6f;
      }
    }
    pnVar11 = &this->m_upper;
    lVar6 = 0x1c;
    pnVar12 = pnVar11;
    pnVar16 = &local_930;
    for (lVar7 = lVar6; lVar7 != 0; lVar7 = lVar7 + -1) {
      (pnVar16->m_backend).data._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
      pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar12 + (ulong)bVar17 * -8 + 4);
      pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar16 + ((ulong)bVar17 * -2 + 1) * 4);
    }
    local_930.m_backend.exp = (this->m_upper).m_backend.exp;
    local_930.m_backend.neg = (this->m_upper).m_backend.neg;
    local_930.m_backend.fpclass = (this->m_upper).m_backend.fpclass;
    local_930.m_backend.prec_elem = (this->m_upper).m_backend.prec_elem;
    pnVar12 = &result_4;
    pnVar16 = &local_9b0;
    for (; lVar6 != 0; lVar6 = lVar6 + -1) {
      (pnVar16->m_backend).data._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
      pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar12 + ((ulong)bVar17 * -2 + 1) * 4);
      pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar16 + ((ulong)bVar17 * -2 + 1) * 4);
    }
    local_9b0.m_backend.exp = result_4.m_backend.exp;
    local_9b0.m_backend.neg = result_4.m_backend.neg;
    local_9b0.m_backend.fpclass = result_4.m_backend.fpclass;
    local_9b0.m_backend.prec_elem = result_4.m_backend.prec_elem;
    (*(this->super_PostStep)._vptr_PostStep[6])(&local_a30,this);
    bVar2 = LErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_930,&local_9b0,&local_a30);
    if (bVar2) {
      pdVar4 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                (&result_7.m_backend,*pdVar4,(type *)0x0);
      tVar3 = boost::multiprecision::operator<
                        (pnVar11,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)&result_7.m_backend);
      if (tVar3) {
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                  (&(x->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[this->m_j].m_backend,
                   &pnVar11->m_backend);
        bVar2 = boost::multiprecision::operator==(pnVar14,pnVar11);
        cStatus->data[this->m_j] = (uint)bVar2 * 2;
        goto LAB_00421b6f;
      }
    }
    pdVar4 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (&result_7.m_backend,-*pdVar4,(type *)0x0);
    tVar3 = boost::multiprecision::operator>
                      (&result_1,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&result_7.m_backend);
    if (tVar3) {
      iVar8 = this->m_j;
      pnVar1 = (x->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar14 = &result_1;
      pnVar10 = pnVar1 + iVar8;
      for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
        (pnVar10->m_backend).data._M_elems[0] = (pnVar14->m_backend).data._M_elems[0];
        pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar14 + ((ulong)bVar17 * -2 + 1) * 4);
        pnVar10 = (pointer)((long)pnVar10 + ((ulong)bVar17 * -2 + 1) * 4);
      }
      pnVar1[iVar8].m_backend.exp = result_1.m_backend.exp;
      pnVar1[iVar8].m_backend.neg = result_1.m_backend.neg;
      pnVar1[iVar8].m_backend.fpclass = result_1.m_backend.fpclass;
      pnVar1[iVar8].m_backend.prec_elem = result_1.m_backend.prec_elem;
      cStatus->data[this->m_j] = BASIC;
      result_7.m_backend.data._M_elems._0_8_ =
           result_7.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
      tVar3 = boost::multiprecision::operator>(&aij,(int *)&result_7);
    }
    else {
      pdVar4 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                (&result_7.m_backend,*pdVar4,(type *)0x0);
      tVar3 = boost::multiprecision::operator<
                        (&result_4,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&result_7.m_backend);
      if (!tVar3) {
        pSVar5 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string
                  ((string *)&result_7,"XMAISM03 This should never happen.",(allocator *)&result_9);
        SPxInternalCodeException::SPxInternalCodeException(pSVar5,(string *)&result_7);
        __cxa_throw(pSVar5,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
      }
      iVar8 = this->m_j;
      pnVar1 = (x->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar14 = &result_4;
      pnVar10 = pnVar1 + iVar8;
      for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
        (pnVar10->m_backend).data._M_elems[0] = (pnVar14->m_backend).data._M_elems[0];
        pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar14 + ((ulong)bVar17 * -2 + 1) * 4);
        pnVar10 = (pointer)((long)pnVar10 + ((ulong)bVar17 * -2 + 1) * 4);
      }
      pnVar1[iVar8].m_backend.exp = result_4.m_backend.exp;
      pnVar1[iVar8].m_backend.neg = result_4.m_backend.neg;
      pnVar1[iVar8].m_backend.fpclass = result_4.m_backend.fpclass;
      pnVar1[iVar8].m_backend.prec_elem = result_4.m_backend.prec_elem;
      cStatus->data[this->m_j] = BASIC;
      result_7.m_backend.data._M_elems._0_8_ =
           result_7.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
      tVar3 = boost::multiprecision::operator>(&aij,(int *)&result_7);
      tVar3 = !tVar3;
    }
    rStatus->data[this->m_i] = (uint)tVar3;
    goto LAB_00421b6f;
  }
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
            (&(x->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[this->m_j].m_backend,
             &(this->m_lower).m_backend);
LAB_0042196c:
  cStatus->data[this->m_j] = FIXED;
LAB_00421b6f:
  result_7.m_backend.fpclass = cpp_dec_float_finite;
  result_7.m_backend.prec_elem = 0x1c;
  result_7.m_backend.data._M_elems[0] = 0;
  result_7.m_backend.data._M_elems[1] = 0;
  result_7.m_backend.data._M_elems[2] = 0;
  result_7.m_backend.data._M_elems[3] = 0;
  result_7.m_backend.data._M_elems[4] = 0;
  result_7.m_backend.data._M_elems[5] = 0;
  result_7.m_backend.data._M_elems[6] = 0;
  result_7.m_backend.data._M_elems[7] = 0;
  result_7.m_backend.data._M_elems[8] = 0;
  result_7.m_backend.data._M_elems[9] = 0;
  result_7.m_backend.data._M_elems[10] = 0;
  result_7.m_backend.data._M_elems[0xb] = 0;
  result_7.m_backend.data._M_elems[0xc] = 0;
  result_7.m_backend.data._M_elems[0xd] = 0;
  result_7.m_backend.data._M_elems[0xe] = 0;
  result_7.m_backend.data._M_elems[0xf] = 0;
  result_7.m_backend.data._M_elems[0x10] = 0;
  result_7.m_backend.data._M_elems[0x11] = 0;
  result_7.m_backend.data._M_elems[0x12] = 0;
  result_7.m_backend.data._M_elems[0x13] = 0;
  result_7.m_backend.data._M_elems[0x14] = 0;
  result_7.m_backend.data._M_elems[0x15] = 0;
  result_7.m_backend.data._M_elems[0x16] = 0;
  result_7.m_backend.data._M_elems[0x17] = 0;
  result_7.m_backend.data._M_elems[0x18] = 0;
  result_7.m_backend.data._M_elems[0x19] = 0;
  result_7.m_backend.data._M_elems._104_5_ = 0;
  result_7.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  result_7.m_backend.exp = 0;
  result_7.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (&result_7.m_backend,&aij.m_backend,
             &(x->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[this->m_j].m_backend);
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
            (&(s->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[this->m_i].m_backend,&result_7.m_backend);
  local_e40 = -1.0;
  result_9.m_backend.fpclass = cpp_dec_float_finite;
  result_9.m_backend.prec_elem = 0x1c;
  result_9.m_backend.data._M_elems[0] = 0;
  result_9.m_backend.data._M_elems[1] = 0;
  result_9.m_backend.data._M_elems[2] = 0;
  result_9.m_backend.data._M_elems[3] = 0;
  result_9.m_backend.data._M_elems[4] = 0;
  result_9.m_backend.data._M_elems[5] = 0;
  result_9.m_backend.data._M_elems[6] = 0;
  result_9.m_backend.data._M_elems[7] = 0;
  result_9.m_backend.data._M_elems[8] = 0;
  result_9.m_backend.data._M_elems[9] = 0;
  result_9.m_backend.data._M_elems[10] = 0;
  result_9.m_backend.data._M_elems[0xb] = 0;
  result_9.m_backend.data._M_elems[0xc] = 0;
  result_9.m_backend.data._M_elems[0xd] = 0;
  result_9.m_backend.data._M_elems[0xe] = 0;
  result_9.m_backend.data._M_elems[0xf] = 0;
  result_9.m_backend.data._M_elems[0x10] = 0;
  result_9.m_backend.data._M_elems[0x11] = 0;
  result_9.m_backend.data._M_elems[0x12] = 0;
  result_9.m_backend.data._M_elems[0x13] = 0;
  result_9.m_backend.data._M_elems[0x14] = 0;
  result_9.m_backend.data._M_elems[0x15] = 0;
  result_9.m_backend.data._M_elems[0x16] = 0;
  result_9.m_backend.data._M_elems[0x17] = 0;
  result_9.m_backend.data._M_elems[0x18] = 0;
  result_9.m_backend.data._M_elems[0x19] = 0;
  result_9.m_backend.data._M_elems._104_5_ = 0;
  result_9.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  result_9.m_backend.exp = 0;
  result_9.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double>
            (&result_9.m_backend,&aij.m_backend,&local_e40);
  result_7.m_backend.fpclass = cpp_dec_float_finite;
  result_7.m_backend.prec_elem = 0x1c;
  result_7.m_backend.data._M_elems[0] = 0;
  result_7.m_backend.data._M_elems[1] = 0;
  result_7.m_backend.data._M_elems[2] = 0;
  result_7.m_backend.data._M_elems[3] = 0;
  result_7.m_backend.data._M_elems[4] = 0;
  result_7.m_backend.data._M_elems[5] = 0;
  result_7.m_backend.data._M_elems[6] = 0;
  result_7.m_backend.data._M_elems[7] = 0;
  result_7.m_backend.data._M_elems[8] = 0;
  result_7.m_backend.data._M_elems[9] = 0;
  result_7.m_backend.data._M_elems[10] = 0;
  result_7.m_backend.data._M_elems[0xb] = 0;
  result_7.m_backend.data._M_elems[0xc] = 0;
  result_7.m_backend.data._M_elems[0xd] = 0;
  result_7.m_backend.data._M_elems[0xe] = 0;
  result_7.m_backend.data._M_elems[0xf] = 0;
  result_7.m_backend.data._M_elems[0x10] = 0;
  result_7.m_backend.data._M_elems[0x11] = 0;
  result_7.m_backend.data._M_elems[0x12] = 0;
  result_7.m_backend.data._M_elems[0x13] = 0;
  result_7.m_backend.data._M_elems[0x14] = 0;
  result_7.m_backend.data._M_elems[0x15] = 0;
  result_7.m_backend.data._M_elems[0x16] = 0;
  result_7.m_backend.data._M_elems[0x17] = 0;
  result_7.m_backend.data._M_elems[0x18] = 0;
  result_7.m_backend.data._M_elems[0x19] = 0;
  result_7.m_backend.data._M_elems._104_5_ = 0;
  result_7.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  result_7.m_backend.exp = 0;
  result_7.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (&result_7.m_backend,&result_9.m_backend,
             &(y->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[this->m_i].m_backend);
  iVar8 = this->m_j;
  pnVar1 = (r->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pcVar13 = &result_7.m_backend;
  pnVar10 = pnVar1 + iVar8;
  for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
    (pnVar10->m_backend).data._M_elems[0] = (pcVar13->data)._M_elems[0];
    pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar17 * -8 + 4);
    pnVar10 = (pointer)((long)pnVar10 + ((ulong)bVar17 * -2 + 1) * 4);
  }
  pnVar1[iVar8].m_backend.exp = result_7.m_backend.exp;
  pnVar1[iVar8].m_backend.neg = result_7.m_backend.neg;
  pnVar1[iVar8].m_backend.fpclass = result_7.m_backend.fpclass;
  pnVar1[iVar8].m_backend.prec_elem = result_7.m_backend.prec_elem;
  return;
}

Assistant:

void SPxMainSM<R>::ZeroObjColSingletonPS::execute(VectorBase<R>& x, VectorBase<R>& y,
      VectorBase<R>& s, VectorBase<R>& r,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{
   // correcting the change of idx by deletion of the column and corresponding rows:
   if(m_j != m_old_j)
   {
      x[m_old_j] = x[m_j];
      r[m_old_j] = r[m_j];
      cStatus[m_old_j] = cStatus[m_j];
   }

   // primal & basis:
   R aij = m_row[m_j];

   if(isZero(s[m_i], R(1e-6)))
      s[m_i] = 0.0;
   else if(s[m_i] >= R(infinity))
      // this is a fix for a highly ill conditioned instance that is "solved" in presolving (ilaser0 from MINLP, mittelmann)
      throw SPxException("Simplifier: infinite activities - aborting unsimplification");

   R scale1 = maxAbs(m_lhs, s[m_i]);
   R scale2 = maxAbs(m_rhs, s[m_i]);

   if(scale1 < 1.0)
      scale1 = 1.0;

   if(scale2 < 1.0)
      scale2 = 1.0;

   R z1 = (m_lhs / scale1) - (s[m_i] / scale1);
   R z2 = (m_rhs / scale2) - (s[m_i] / scale2);

   if(isZero(z1, this->epsilon()))
      z1 = 0.0;

   if(isZero(z2, this->epsilon()))
      z2 = 0.0;

   R lo = (aij > 0) ? z1 * scale1 / aij : z2 * scale2 / aij;
   R up = (aij > 0) ? z2 * scale2 / aij : z1 * scale1 / aij;

   if(isZero(lo, this->feastol()))
      lo = 0.0;

   if(isZero(up, this->feastol()))
      up = 0.0;

   assert(LErel(lo, up, this->epsilon()));
   SOPLEX_ASSERT_WARN("WMAISM01", isNotZero(aij, R(1.0 / R(infinity))));

   if(rStatus[m_i] == SPxSolverBase<R>::ON_LOWER)
   {
      if(m_lower <= R(-infinity) && m_upper >= R(infinity))
      {
         x[m_j] = 0.0;
         cStatus[m_j] = SPxSolverBase<R>::ZERO;
      }
      else if(m_lower == m_upper)
      {
         x[m_j]       = m_lower;
         cStatus[m_j] = SPxSolverBase<R>::FIXED;
      }
      else if(aij > 0)
      {
         x[m_j]       = m_upper;
         cStatus[m_j] = SPxSolverBase<R>::ON_UPPER;
      }
      else if(aij < 0)
      {
         x[m_j]       = m_lower;
         cStatus[m_j] = SPxSolverBase<R>::ON_LOWER;
      }
      else
         throw SPxInternalCodeException("XMAISM01 This should never happen.");
   }
   else if(rStatus[m_i] == SPxSolverBase<R>::ON_UPPER)
   {
      if(m_lower <= R(-infinity) && m_upper >= R(infinity))
      {
         x[m_j] = 0.0;
         cStatus[m_j] = SPxSolverBase<R>::ZERO;
      }
      else if(m_lower == m_upper)
      {
         x[m_j]       = m_lower;
         cStatus[m_j] = SPxSolverBase<R>::FIXED;
      }
      else if(aij > 0)
      {
         x[m_j]       = m_lower;
         cStatus[m_j] = SPxSolverBase<R>::ON_LOWER;
      }
      else if(aij < 0)
      {
         x[m_j]       = m_upper;
         cStatus[m_j] = SPxSolverBase<R>::ON_UPPER;
      }
      else
         throw SPxInternalCodeException("XMAISM02 This should never happen.");
   }
   else if(rStatus[m_i] == SPxSolverBase<R>::FIXED)
   {
      if(m_lower <= R(-infinity) && m_upper >= R(infinity))
      {
         x[m_j] = 0.0;
         cStatus[m_j] = SPxSolverBase<R>::ZERO;
      }
      else
      {
         assert(EQrel(m_lower, m_upper, this->feastol()));

         x[m_j]        = (m_lower + m_upper) / 2.0;
         cStatus[m_j]  = SPxSolverBase<R>::FIXED;
      }
   }
   else if(rStatus[m_i] == SPxSolverBase<R>::BASIC)
   {
      if(GErel(m_lower, lo, this->feastol()) && m_lower > R(-infinity))
      {
         x[m_j]       = m_lower;
         cStatus[m_j] = (m_lower == m_upper) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
      }
      else if(LErel(m_upper, up, this->feastol()) && m_upper < R(infinity))
      {
         x[m_j]       = m_upper;
         cStatus[m_j] = (m_lower == m_upper) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
      }
      else if(lo > R(-infinity))
      {
         // make m_i non-basic and m_j basic
         x[m_j]       = lo;
         cStatus[m_j] = SPxSolverBase<R>::BASIC;
         rStatus[m_i] = (aij > 0 ? SPxSolverBase<R>::ON_LOWER : SPxSolverBase<R>::ON_UPPER);
      }
      else if(up < R(infinity))
      {
         // make m_i non-basic and m_j basic
         x[m_j]       = up;
         cStatus[m_j] = SPxSolverBase<R>::BASIC;
         rStatus[m_i] = (aij > 0 ? SPxSolverBase<R>::ON_UPPER : SPxSolverBase<R>::ON_LOWER);
      }
      else
         throw SPxInternalCodeException("XMAISM03 This should never happen.");
   }
   else
      throw SPxInternalCodeException("XMAISM04 This should never happen.");

   s[m_i] += aij * x[m_j];

   // dual:
   r[m_j] = -1.0 * aij * y[m_i];

   assert(!isOptimal || (cStatus[m_j] != SPxSolverBase<R>::BASIC || isZero(r[m_j], this->feastol())));

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(!this->checkBasisDim(rStatus, cStatus))
   {
      throw SPxInternalCodeException("XMAISM21 Dimension doesn't match after this step.");
   }

#endif
}